

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Regexp * __thiscall re2::Regexp::Incref(Regexp *this)

{
  Mutex *this_00;
  int iVar1;
  mapped_type *pmVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  undefined1 local_21;
  key_type local_20;
  
  if (this->ref_ < 0xfffe) {
    this->ref_ = this->ref_ + 1;
  }
  else {
    local_20 = (key_type)&local_21;
    *in_FS_OFFSET = (long)&local_20;
    *in_FS_OFFSET =
         (long)std::once_flag::_Prepare_execution::
               _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
               ::anon_class_1_0_00000001::__invoke;
    iVar1 = pthread_once(&Incref::ref_once._M_once,__once_proxy);
    if (iVar1 != 0) {
      uVar3 = std::__throw_system_error(iVar1);
      Mutex::Unlock((Mutex *)(undefined *)0x0);
      _Unwind_Resume(uVar3);
    }
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    this_00 = ref_mutex;
    Mutex::Lock(ref_mutex);
    local_20 = this;
    if (this->ref_ == 0xffff) {
      pmVar2 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[](ref_map,&local_20);
      *pmVar2 = *pmVar2 + 1;
    }
    else {
      pmVar2 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[](ref_map,&local_20);
      *pmVar2 = 0xffff;
      this->ref_ = 0xffff;
    }
    Mutex::Unlock(this_00);
  }
  return this;
}

Assistant:

Regexp* Regexp::Incref() {
  if (ref_ >= kMaxRef-1) {
    static std::once_flag ref_once;
    std::call_once(ref_once, []() {
      ref_mutex = new Mutex;
      ref_map = new map<Regexp*, int>;
    });

    // Store ref count in overflow map.
    MutexLock l(ref_mutex);
    if (ref_ == kMaxRef) {
      // already overflowed
      (*ref_map)[this]++;
    } else {
      // overflowing now
      (*ref_map)[this] = kMaxRef;
      ref_ = kMaxRef;
    }
    return this;
  }

  ref_++;
  return this;
}